

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger closure_getinfos(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQClosure *pSVar3;
  SQFunctionProto *pSVar4;
  SQObjectPtr *pSVar5;
  SQObjectValue SVar6;
  SQArray *x;
  SQNativeClosure *nc;
  SQInteger n;
  long lVar7;
  long lVar8;
  SQUnsignedInteger n_1;
  long nInitialSize;
  SQClass *nidx;
  SQObjectPtr params;
  SQObjectPtr local_68;
  SQObjectPtr defparams;
  SQObjectPtr local_48;
  SQObjectValue local_38;
  
  pSVar5 = stack_get(v,1);
  SVar2 = (pSVar5->super_SQObject)._type;
  pSVar3 = (pSVar5->super_SQObject)._unVal.pClosure;
  SVar6.pTable = SQTable::Create(v->_sharedstate,4);
  if (SVar2 == OT_CLOSURE) {
    pSVar4 = pSVar3->_function;
    nInitialSize = (pSVar4->_nparameters + 1) - (ulong)(pSVar4->_varparams == 0);
    local_38.pTable = SVar6.pTable;
    params.super_SQObject._unVal.pArray = SQArray::Create(v->_sharedstate,nInitialSize);
    params.super_SQObject._type = OT_ARRAY;
    pSVar1 = &((params.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    defparams.super_SQObject._unVal.pArray =
         SQArray::Create(v->_sharedstate,pSVar4->_ndefaultparams);
    defparams.super_SQObject._type = OT_ARRAY;
    pSVar1 = &((defparams.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < pSVar4->_nparameters; lVar7 = lVar7 + 1) {
      SQArray::Set(params.super_SQObject._unVal.pArray,lVar7,
                   (SQObjectPtr *)((long)&(pSVar4->_parameters->super_SQObject)._type + lVar8));
      lVar8 = lVar8 + 0x10;
    }
    lVar8 = 0;
    for (lVar7 = 0; SVar6 = params.super_SQObject._unVal, lVar7 < pSVar4->_ndefaultparams;
        lVar7 = lVar7 + 1) {
      SQArray::Set(defparams.super_SQObject._unVal.pArray,lVar7,
                   (SQObjectPtr *)((long)&(pSVar3->_defaultparams->super_SQObject)._type + lVar8));
      lVar8 = lVar8 + 0x10;
    }
    if (pSVar4->_varparams != 0) {
      local_68.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"...",-1);
      local_68.super_SQObject._type = OT_STRING;
      pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQArray::Set(SVar6.pArray,nInitialSize + -1,&local_68);
      SQObjectPtr::~SQObjectPtr(&local_68);
    }
    local_68.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"native",-1);
    SVar6 = local_38;
    local_68.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_48.super_SQObject._type = OT_BOOL;
    local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
    SQTable::NewSlot(local_38.pTable,&local_68,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    SQObjectPtr::~SQObjectPtr(&local_68);
    local_68.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"name",-1);
    local_68.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQTable::NewSlot(SVar6.pTable,&local_68,&pSVar4->_name);
    SQObjectPtr::~SQObjectPtr(&local_68);
    local_68.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"src",-1);
    local_68.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQTable::NewSlot(SVar6.pTable,&local_68,&pSVar4->_sourcename);
    SQObjectPtr::~SQObjectPtr(&local_68);
    local_68.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"parameters",-1);
    local_68.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQTable::NewSlot(SVar6.pTable,&local_68,&params);
    SQObjectPtr::~SQObjectPtr(&local_68);
    local_68.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"varargs",-1);
    local_68.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_48.super_SQObject._unVal = (SQObjectValue)pSVar4->_varparams;
    local_48.super_SQObject._type = OT_INTEGER;
    SQTable::NewSlot(SVar6.pTable,&local_68,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    SQObjectPtr::~SQObjectPtr(&local_68);
    local_68.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"defparams",-1);
    local_68.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQTable::NewSlot(SVar6.pTable,&local_68,&defparams);
    SQObjectPtr::~SQObjectPtr(&local_68);
  }
  else {
    params.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"native",-1);
    params.super_SQObject._type = OT_STRING;
    pSVar1 = &((params.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    defparams.super_SQObject._type = OT_BOOL;
    defparams.super_SQObject._unVal.nInteger = 1;
    SQTable::NewSlot(SVar6.pTable,&params,&defparams);
    SQObjectPtr::~SQObjectPtr(&defparams);
    SQObjectPtr::~SQObjectPtr(&params);
    params.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"name",-1);
    params.super_SQObject._type = OT_STRING;
    pSVar1 = &((params.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQTable::NewSlot(SVar6.pTable,&params,
                     (SQObjectPtr *)&pSVar3[1].super_SQCollectable.super_SQRefCounted._weakref);
    SQObjectPtr::~SQObjectPtr(&params);
    params.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"paramscheck",-1);
    params.super_SQObject._type = OT_STRING;
    pSVar1 = &((params.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    defparams.super_SQObject._unVal = (SQObjectValue)pSVar3->_env;
    defparams.super_SQObject._type = OT_INTEGER;
    SQTable::NewSlot(SVar6.pTable,&params,&defparams);
    SQObjectPtr::~SQObjectPtr(&defparams);
    SQObjectPtr::~SQObjectPtr(&params);
    params.super_SQObject._type = OT_NULL;
    params.super_SQObject._unVal.pTable = (SQTable *)0x0;
    if (pSVar3->_base != (SQClass *)0x0) {
      x = SQArray::Create(v->_sharedstate,(SQInteger)pSVar3->_base);
      SQObjectPtr::operator=(&params,x);
      for (nidx = (SQClass *)0x0; nidx < pSVar3->_base;
          nidx = (SQClass *)
                 ((long)&(nidx->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1)) {
        defparams.super_SQObject._unVal =
             *(SQObjectValue *)
              (&(pSVar3->_root->super_SQRefCounted)._vptr_SQRefCounted + (long)nidx);
        defparams.super_SQObject._type = OT_INTEGER;
        SQArray::Set(params.super_SQObject._unVal.pArray,(SQInteger)nidx,&defparams);
        SQObjectPtr::~SQObjectPtr(&defparams);
      }
    }
    defparams.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"typecheck",-1);
    defparams.super_SQObject._type = OT_STRING;
    pSVar1 = &((defparams.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQTable::NewSlot(SVar6.pTable,&defparams,&params);
  }
  SQObjectPtr::~SQObjectPtr(&defparams);
  SQObjectPtr::~SQObjectPtr(&params);
  params.super_SQObject._type = OT_TABLE;
  pSVar1 = &((SVar6.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  params.super_SQObject._unVal = SVar6;
  SQVM::Push(v,&params);
  SQObjectPtr::~SQObjectPtr(&params);
  return 1;
}

Assistant:

static SQInteger closure_getinfos(HSQUIRRELVM v) {
    SQObject o = stack_get(v,1);
    SQTable *res = SQTable::Create(_ss(v),4);
    if(sq_type(o) == OT_CLOSURE) {
        SQFunctionProto *f = _closure(o)->_function;
        SQInteger nparams = f->_nparameters + (f->_varparams?1:0);
        SQObjectPtr params = SQArray::Create(_ss(v),nparams);
    SQObjectPtr defparams = SQArray::Create(_ss(v),f->_ndefaultparams);
        for(SQInteger n = 0; n<f->_nparameters; n++) {
            _array(params)->Set((SQInteger)n,f->_parameters[n]);
        }
    for(SQInteger j = 0; j<f->_ndefaultparams; j++) {
            _array(defparams)->Set((SQInteger)j,_closure(o)->_defaultparams[j]);
        }
        if(f->_varparams) {
            _array(params)->Set(nparams-1,SQString::Create(_ss(v),_SC("..."),-1));
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),false);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),f->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("src"),-1),f->_sourcename);
        res->NewSlot(SQString::Create(_ss(v),_SC("parameters"),-1),params);
        res->NewSlot(SQString::Create(_ss(v),_SC("varargs"),-1),f->_varparams);
    res->NewSlot(SQString::Create(_ss(v),_SC("defparams"),-1),defparams);
    }
    else { //OT_NATIVECLOSURE
        SQNativeClosure *nc = _nativeclosure(o);
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),true);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),nc->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("paramscheck"),-1),nc->_nparamscheck);
        SQObjectPtr typecheck;
        if(nc->_typecheck.size() > 0) {
            typecheck =
                SQArray::Create(_ss(v), nc->_typecheck.size());
            for(SQUnsignedInteger n = 0; n<nc->_typecheck.size(); n++) {
                    _array(typecheck)->Set((SQInteger)n,nc->_typecheck[n]);
            }
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("typecheck"),-1),typecheck);
    }
    v->Push(res);
    return 1;
}